

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall
lzham::lzcompressor::code_decision
          (lzcompressor *this,lzdecision lzdec,uint *cur_ofs,uint *bytes_to_match)

{
  bool bVar1;
  uint num_bytes;
  int *in_RCX;
  long in_RDI;
  int *in_R8;
  uint len;
  CLZBase *in_stack_00000028;
  symbol_codec *in_stack_00000030;
  
  num_bytes = lzdecision::get_len((lzdecision *)0x114e01);
  bVar1 = state::encode((state *)lzdec._0_8_,in_stack_00000030,in_stack_00000028,
                        (search_accelerator *)this,(lzdecision *)cur_ofs);
  if (bVar1) {
    *in_RCX = num_bytes + *in_RCX;
    *in_R8 = *in_R8 - num_bytes;
    search_accelerator::advance_bytes((search_accelerator *)(in_RDI + 0x17d8),num_bytes);
    *(int *)(in_RDI + 0x3870) = *(int *)(in_RDI + 0x3870) + 1;
  }
  return bVar1;
}

Assistant:

bool lzcompressor::code_decision(lzdecision lzdec, uint& cur_ofs, uint& bytes_to_match)
   {
#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(CLZBase::cLZHAMDebugSyncMarkerValue, CLZBase::cLZHAMDebugSyncMarkerBits)) return false;
      if (!m_codec.encode_bits(lzdec.is_match(), 1)) return false;
      if (!m_codec.encode_bits(lzdec.get_len(), 9)) return false;
      if (!m_codec.encode_bits(m_state.m_cur_state, 4)) return false;
#endif

#ifdef LZHAM_LZVERIFY
      if (lzdec.is_match())
      {
         uint match_dist = lzdec.get_match_dist(m_state);

         LZHAM_VERIFY(m_accel[cur_ofs] == m_accel[(cur_ofs - match_dist) & (m_accel.get_max_dict_size() - 1)]);
      }
#endif

      const uint len = lzdec.get_len();

      if (!m_state.encode(m_codec, *this, m_accel, lzdec))
         return false;

      cur_ofs += len;
      LZHAM_ASSERT(bytes_to_match >= len);
      bytes_to_match -= len;

      m_accel.advance_bytes(len);

      m_step++;

      return true;
   }